

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O3

bool __thiscall deqp::gles31::Functional::ProgramInterfaceDefinition::Shader::isValid(Shader *this)

{
  DataType DVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  VarType *pVVar6;
  Storage *pSVar7;
  ulong uVar8;
  long lVar9;
  pointer pVVar10;
  pointer pIVar11;
  uint uVar12;
  long lVar13;
  Interpolation *pIVar14;
  long lVar15;
  pointer pIVar16;
  pointer *ppiVar17;
  Layout layoutWithLocationAndBinding;
  Layout local_44;
  
  pVVar10 = (this->m_defaultBlock).variables.
            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_defaultBlock).variables.
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10) >> 5) *
          -0x55555555) {
    lVar13 = 0x20;
    lVar9 = 0;
    do {
      if (*(int *)((long)pVVar10 + lVar13 + -0x1c) == -1) {
        bVar4 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                          ((VarType *)((long)&(pVVar10->layout).location + lVar13),
                           glu::isDataTypeAtomicCounter);
        if (bVar4) {
          return false;
        }
        pVVar10 = (this->m_defaultBlock).variables.
                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      if (*(int *)((long)&(pVVar10->layout).location + lVar13) == 2) {
        bVar4 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                          ((VarType *)((long)&(pVVar10->layout).location + lVar13),
                           glu::isDataTypeAtomicCounter);
        if (bVar4) {
          return false;
        }
        pVVar10 = (this->m_defaultBlock).variables.
                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      if (*(int *)((long)pVVar10 + lVar13 + -0x10) != 2) {
        return false;
      }
      bVar4 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                        ((VarType *)((long)&(pVVar10->layout).location + lVar13),
                         glu::isDataTypeSampler);
      if (bVar4) {
        pVVar10 = (this->m_defaultBlock).variables.
                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        glu::Layout::Layout(&local_44,*(int *)((long)pVVar10 + lVar13 + -0x20),
                            *(int *)((long)pVVar10 + lVar13 + -0x1c),-1,FORMATLAYOUT_LAST,
                            MATRIXORDER_LAST);
        bVar4 = glu::Layout::operator!=
                          ((Layout *)
                           ((long)(this->m_defaultBlock).variables.
                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x20),
                           &local_44);
        if (bVar4) {
          return false;
        }
      }
      lVar9 = lVar9 + 1;
      pVVar10 = (this->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x60;
    } while (lVar9 < (int)((ulong)((long)(this->m_defaultBlock).variables.
                                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10)
                          >> 5) * -0x55555555);
  }
  pIVar16 = (this->m_defaultBlock).interfaceBlocks.
            super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar11 = (this->m_defaultBlock).interfaceBlocks.
            super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pIVar11 - (long)pIVar16) >> 4) * 0x38e38e39) {
    uVar8 = 0;
    do {
      piVar2 = pIVar16[uVar8].dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                ((long)&pIVar16[uVar8].dimensions.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl + 8);
      if (4 < (ulong)((long)piVar3 - (long)piVar2)) {
        return false;
      }
      if ((piVar2 != piVar3) && (pIVar16[uVar8].instanceName._M_string_length == 0)) {
        return false;
      }
      lVar9 = *(long *)&pIVar16[uVar8].variables.
                        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ._M_impl.super__Vector_impl_data;
      if (0 < (int)((ulong)((long)*(pointer *)
                                   ((long)&pIVar16[uVar8].variables.
                                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                           ._M_impl + 8) - lVar9) >> 5) * -0x55555555) {
        lVar15 = 0x20;
        lVar13 = 0;
        do {
          bVar4 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                            ((VarType *)(lVar9 + lVar15),
                             ProgramInterfaceDefinition::anon_unknown_0::isOpaqueType);
          if (bVar4) {
            return false;
          }
          lVar13 = lVar13 + 1;
          lVar9 = *(long *)&pIVar16[uVar8].variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl.super__Vector_impl_data;
          lVar15 = lVar15 + 0x60;
        } while (lVar13 < (int)((ulong)((long)*(pointer *)
                                               ((long)&pIVar16[uVar8].variables.
                                                                                                              
                                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                                  ._M_impl + 8) - lVar9) >> 5) * -0x55555555);
        pIVar16 = (this->m_defaultBlock).interfaceBlocks.
                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pIVar11 = (this->m_defaultBlock).interfaceBlocks.
                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar12 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar12;
      iVar5 = (int)((ulong)((long)pIVar11 - (long)pIVar16) >> 4);
    } while (SBORROW4(uVar12,iVar5 * 0x38e38e39) != (int)(uVar12 + iVar5 * -0x38e38e39) < 0);
  }
  switch(this->m_shaderType) {
  case SHADERTYPE_VERTEX:
    pVVar10 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (int)((long)(this->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 5) *
             -0x55555555;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      pIVar14 = &pVVar10->interpolation;
      do {
        if (pIVar14[1] == STORAGE_OUT) {
          bVar4 = isIllegalVertexOutput((VarType *)(pIVar14 + 3),false,false);
          if (bVar4) {
            return false;
          }
          if ((*pIVar14 != INTERPOLATION_FLAT) &&
             (bVar4 = isTypeIntegerOrContainsIntegers((VarType *)(pIVar14 + 3)), bVar4)) {
            return false;
          }
        }
        else if (pIVar14[1] == STORAGE_IN) {
          if (((VarType *)(pIVar14 + 3))->m_type != TYPE_BASIC) {
            return false;
          }
          if ((((Data *)(pIVar14 + 5))->basic).type - TYPE_BOOL < 4) {
            return false;
          }
        }
        pIVar14 = pIVar14 + 0x18;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    uVar12 = (int)((long)pIVar11 - (long)pIVar16 >> 4) * 0x38e38e39;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      pSVar7 = &pIVar16->storage;
      do {
        if ((*pSVar7 < STORAGE_LAST) && ((0x61U >> (*pSVar7 & 0x1f) & 1) != 0)) {
          return false;
        }
        pSVar7 = pSVar7 + 0x24;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    break;
  case SHADERTYPE_FRAGMENT:
    pVVar10 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (int)((long)(this->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 5) *
             -0x55555555;
    if (0 < (int)uVar12) {
      uVar8 = 0;
      do {
        if (pVVar10[uVar8].storage == STORAGE_OUT) {
          bVar4 = false;
          for (pVVar6 = &pVVar10[uVar8].varType; pVVar6->m_type == TYPE_ARRAY;
              pVVar6 = (pVVar6->m_data).array.elementType) {
            if (bVar4) {
              return false;
            }
            bVar4 = true;
          }
          if (pVVar6->m_type != TYPE_BASIC) {
            return false;
          }
          DVar1 = (pVVar6->m_data).basic.type;
          if ((DVar1 - TYPE_FLOAT < 0x23) &&
             ((0x7fc01e00fU >> ((ulong)(DVar1 - TYPE_FLOAT) & 0x3f) & 1) != 0)) {
            bVar4 = false;
          }
          else {
            if (DVar1 - TYPE_BOOL_VEC2 < 3) {
              return false;
            }
            bVar4 = DVar1 - TYPE_INT < 0xfffffff7 && DVar1 - TYPE_DOUBLE < 0xfffffff7;
          }
          if (DVar1 - TYPE_BOOL < 4) {
            return false;
          }
          if (bVar4) {
            return false;
          }
          if (DVar1 - TYPE_FLOAT_MAT2 < 9) {
            return false;
          }
          if (DVar1 - TYPE_DOUBLE_MAT2 < 9) {
            return false;
          }
        }
        else if (pVVar10[uVar8].storage == STORAGE_IN) {
          bVar4 = isIllegalVertexOutput(&pVVar10[uVar8].varType,false,false);
          if (bVar4) {
            return false;
          }
          if ((pVVar10[uVar8].interpolation != INTERPOLATION_FLAT) &&
             (bVar4 = isTypeIntegerOrContainsIntegers(&pVVar10[uVar8].varType), bVar4)) {
            return false;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != (uVar12 & 0x7fffffff));
    }
    uVar12 = (int)((long)pIVar11 - (long)pIVar16 >> 4) * 0x38e38e39;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      pSVar7 = &pIVar16->storage;
      do {
        if ((*pSVar7 < STORAGE_LAST) && ((0x62U >> (*pSVar7 & 0x1f) & 1) != 0)) {
          return false;
        }
        pSVar7 = pSVar7 + 0x24;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    break;
  case SHADERTYPE_GEOMETRY:
    pVVar10 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (int)((long)(this->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 5) *
             -0x55555555;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      pVVar6 = &pVVar10->varType;
      do {
        if (*(MatrixOrder *)((long)(pVVar6 + -1) + 0x10) == 0) {
          if (pVVar6->m_type != TYPE_ARRAY) {
            return false;
          }
        }
        else if (*(MatrixOrder *)((long)(pVVar6 + -1) + 0x10) - 5 < 2) {
          return false;
        }
        pVVar6 = pVVar6 + 4;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    uVar12 = (int)((long)pIVar11 - (long)pIVar16 >> 4) * 0x38e38e39;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      ppiVar17 = (pointer *)
                 ((long)&(pIVar16->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 + 8);
      do {
        if (*(int *)((long)ppiVar17 + -0x6c) == 0) {
          if (((_Vector_impl_data *)(ppiVar17 + -1))->_M_start == *ppiVar17) {
            return false;
          }
        }
        else if (*(int *)((long)ppiVar17 + -0x6c) - 5U < 2) {
          return false;
        }
        ppiVar17 = ppiVar17 + 0x12;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    pVVar10 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (int)((long)(this->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 5) *
             -0x55555555;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      pVVar6 = &pVVar10->varType;
      do {
        iVar5 = *(MatrixOrder *)((long)(pVVar6 + -1) + 0x10);
        if ((iVar5 == 0) || (iVar5 == 1)) {
          if (pVVar6->m_type != TYPE_ARRAY) {
            return false;
          }
        }
        else if (iVar5 == 5) {
          return false;
        }
        pVVar6 = pVVar6 + 4;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    uVar12 = (int)((long)pIVar11 - (long)pIVar16 >> 4) * 0x38e38e39;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      ppiVar17 = (pointer *)
                 ((long)&(pIVar16->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 + 8);
      do {
        iVar5 = *(int *)((long)ppiVar17 + -0x6c);
        if ((iVar5 == 0) || (iVar5 == 1)) {
          if (((_Vector_impl_data *)(ppiVar17 + -1))->_M_start == *ppiVar17) {
            return false;
          }
        }
        else if (iVar5 == 5) {
          return false;
        }
        ppiVar17 = ppiVar17 + 0x12;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    break;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    pVVar10 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (int)((long)(this->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 5) *
             -0x55555555;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      pVVar6 = &pVVar10->varType;
      do {
        if (*(MatrixOrder *)((long)(pVVar6 + -1) + 0x10) == 0) {
          if (pVVar6->m_type != TYPE_ARRAY) {
            return false;
          }
        }
        else if (*(MatrixOrder *)((long)(pVVar6 + -1) + 0x10) == 6) {
          return false;
        }
        pVVar6 = pVVar6 + 4;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    uVar12 = (int)((long)pIVar11 - (long)pIVar16 >> 4) * 0x38e38e39;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      ppiVar17 = (pointer *)
                 ((long)&(pIVar16->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 + 8);
      do {
        if (*(int *)((long)ppiVar17 + -0x6c) == 0) {
          if (((_Vector_impl_data *)(ppiVar17 + -1))->_M_start == *ppiVar17) {
            return false;
          }
        }
        else if (*(int *)((long)ppiVar17 + -0x6c) == 6) {
          return false;
        }
        ppiVar17 = ppiVar17 + 0x12;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    break;
  case SHADERTYPE_COMPUTE:
    pVVar10 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (int)((long)(this->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 5) *
             -0x55555555;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      pSVar7 = &pVVar10->storage;
      do {
        if ((*pSVar7 < STORAGE_LAST) && ((99U >> (*pSVar7 & 0x1f) & 1) != 0)) {
          return false;
        }
        pSVar7 = pSVar7 + 0x18;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    uVar12 = (int)((long)pIVar11 - (long)pIVar16 >> 4) * 0x38e38e39;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)(uVar12 & 0x7fffffff);
      pSVar7 = &pIVar16->storage;
      do {
        if ((*pSVar7 < STORAGE_LAST) && ((99U >> (*pSVar7 & 0x1f) & 1) != 0)) {
          return false;
        }
        pSVar7 = pSVar7 + 0x24;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  return true;
}

Assistant:

bool Shader::isValid (void) const
{
	// Default block variables
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			// atomic declaration in the default block without binding
			if (m_defaultBlock.variables[varNdx].layout.binding == -1 &&
				containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeAtomicCounter))
				return false;

			// atomic declaration in a struct
			if (m_defaultBlock.variables[varNdx].varType.isStructType() &&
				containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeAtomicCounter))
				return false;

			// Unsupported layout qualifiers

			if (m_defaultBlock.variables[varNdx].layout.matrixOrder != glu::MATRIXORDER_LAST)
				return false;

			if (containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeSampler))
			{
				const glu::Layout layoutWithLocationAndBinding(m_defaultBlock.variables[varNdx].layout.location, m_defaultBlock.variables[varNdx].layout.binding);

				if (m_defaultBlock.variables[varNdx].layout != layoutWithLocationAndBinding)
					return false;
			}
		}
	}

	// Interface blocks
	{
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			// ES31 disallows interface block array arrays
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.size() > 1)
				return false;

			// Interface block arrays must have instance name
			if (!m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty() && m_defaultBlock.interfaceBlocks[interfaceNdx].instanceName.empty())
				return false;

			// Opaque types in interface block
			if (containsMatchingSubtype(m_defaultBlock.interfaceBlocks[interfaceNdx].variables, isOpaqueType))
				return false;
		}
	}

	// Shader type specific

	if (m_shaderType == glu::SHADERTYPE_VERTEX)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && isIllegalVertexInput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && isIllegalVertexOutput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && m_defaultBlock.variables[varNdx].interpolation != glu::INTERPOLATION_FLAT && isTypeIntegerOrContainsIntegers(m_defaultBlock.variables[varNdx].varType))
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_FRAGMENT)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && isIllegalFragmentInput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && m_defaultBlock.variables[varNdx].interpolation != glu::INTERPOLATION_FLAT && isTypeIntegerOrContainsIntegers(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && isIllegalFragmentOutput(m_defaultBlock.variables[varNdx].varType))
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_COMPUTE)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_GEOMETRY)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN)
				return false;
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
			// arrayed output
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN)
				return false;
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
			// arrayed output
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
				return false;
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
				return false;
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else
		DE_ASSERT(false);

	return true;
}